

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_get_token2(char **ptr,char *delimiter,char **token,int *isanumber,int *status)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  int *piVar5;
  undefined4 *in_RCX;
  long *in_RDX;
  char *in_RSI;
  long *in_RDI;
  int *in_R8;
  double dval;
  int slen;
  char tval [73];
  char *loc;
  char local_88 [72];
  undefined1 local_40;
  char *local_38;
  int *local_30;
  undefined4 *local_28;
  long *local_20;
  long *local_10;
  int local_4;
  
  if (*in_R8 == 0) {
    while (*(char *)*in_RDI == ' ') {
      *in_RDI = *in_RDI + 1;
    }
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_10 = in_RDI;
    sVar2 = strcspn((char *)*in_RDI,in_RSI);
    iVar1 = (int)sVar2;
    local_4 = iVar1;
    if (iVar1 != 0) {
      pvVar3 = calloc((long)(iVar1 + 1),1);
      *local_20 = (long)pvVar3;
      if (*local_20 == 0) {
        ffpmsg((char *)0x1223e6);
        *local_30 = 0x71;
        local_4 = 0;
      }
      else {
        strncat((char *)*local_20,(char *)*local_10,(long)iVar1);
        *local_10 = *local_10 + (long)iVar1;
        if (local_28 != (undefined4 *)0x0) {
          *local_28 = 1;
          pcVar4 = strchr((char *)*local_20,0x44);
          if (pcVar4 == (char *)0x0) {
            strtod((char *)*local_20,&local_38);
          }
          else {
            strncpy(local_88,(char *)*local_20,0x48);
            local_40 = 0;
            local_38 = strchr(local_88,0x44);
            if (local_38 != (char *)0x0) {
              *local_38 = 'E';
            }
            strtod(local_88,&local_38);
          }
          if ((*local_38 != '\0') && (*local_38 != ' ')) {
            *local_28 = 0;
          }
          piVar5 = __errno_location();
          if (*piVar5 == 0x22) {
            *local_28 = 0;
          }
        }
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int fits_get_token2(char **ptr, 
                   char *delimiter,
                   char **token,
                   int *isanumber,  /* O - is this token a number? */
		   int *status)

/*
   parse off the next token, delimited by a character in 'delimiter',
   from the input ptr string;  increment *ptr to the end of the token.
   Returns the length of the token, not including the delimiter char;

   This routine allocates the *token string;  the calling routine must free it 
*/
{
    char *loc, tval[73];
    int slen;
    double dval;
    
    if (*status)
        return(0);
	
    while (**ptr == ' ')  /* skip over leading blanks */
        (*ptr)++;

    slen = strcspn(*ptr, delimiter);  /* length of next token */
    if (slen)
    {
	*token = (char *) calloc(slen + 1, 1); 
	if (!(*token)) {
          ffpmsg("Couldn't allocate memory to hold token string (fits_get_token2).");
          *status = MEMORY_ALLOCATION ;
	  return(0);
        }
 
        strncat(*token, *ptr, slen);       /* copy token */
        (*ptr) += slen;                   /* skip over the token */

        if (isanumber)  /* check if token is a number */
        {
            *isanumber = 1;

	    if (strchr(*token, 'D'))  {
	        strncpy(tval, *token, 72);
		tval[72] = '\0';

	        /*  The C language does not support a 'D'; replace with 'E' */
	        if ((loc = strchr(tval, 'D'))) *loc = 'E';

	        dval =  strtod(tval, &loc);
	    } else {
	        dval =  strtod(*token, &loc);
 	    }

	    /* check for read error, or junk following the value */
	    if (*loc != '\0' && *loc != ' ' ) *isanumber = 0;
	    if (errno == ERANGE) *isanumber = 0;
        }
    }

    return(slen);
}